

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O3

void __thiscall discordpp::Message::Message(Message *this,Message *param_1)

{
  _Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_> _Var1;
  _Head_base<0UL,_bool_*,_false> _Var2;
  _Head_base<0UL,_int_*,_false> _Var3;
  _Head_base<0UL,_discordpp::Snowflake_*,_false> _Var4;
  _Head_base<0UL,_discordpp::Snowflake_*,_false> _Var5;
  _Head_base<0UL,_bool_*,_false> _Var6;
  _Head_base<0UL,_int_*,_false> _Var7;
  
  _Var1.super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl =
       (param_1->id).t_._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>;
  if (_Var1.super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl == (Snowflake *)0x0) {
    _Var4._M_head_impl = (Snowflake *)0x0;
  }
  else {
    _Var4._M_head_impl = (Snowflake *)operator_new(8);
    (_Var4._M_head_impl)->_value =
         *(uint64_t *)_Var1.super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
  }
  (this->id).t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false> =
       (_Head_base<0UL,_discordpp::Snowflake_*,_false>)_Var4._M_head_impl;
  (this->id).s_ = (param_1->id).s_;
  _Var4._M_head_impl =
       (param_1->channel_id).t_._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
  if (_Var4._M_head_impl == (Snowflake *)0x0) {
    _Var5._M_head_impl = (Snowflake *)0x0;
  }
  else {
    _Var5._M_head_impl = (Snowflake *)operator_new(8);
    (_Var5._M_head_impl)->_value = (_Var4._M_head_impl)->_value;
  }
  (this->channel_id).t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = _Var5._M_head_impl;
  (this->channel_id).s_ = (param_1->channel_id).s_;
  field<discordpp::User>::field(&this->author,&param_1->author);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->content,&param_1->content);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->timestamp,&param_1->timestamp);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->edited_timestamp).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&(param_1->edited_timestamp).
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->edited_timestamp)._vptr_nullable_field = (_func_int **)&PTR_operator__0024a208;
  _Var2._M_head_impl =
       (param_1->tts).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var2._M_head_impl == (bool *)0x0) {
    _Var6._M_head_impl = (bool *)0x0;
  }
  else {
    _Var6._M_head_impl = (bool *)operator_new(1);
    *_Var6._M_head_impl = *_Var2._M_head_impl;
  }
  (this->tts).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = _Var6._M_head_impl;
  (this->tts).s_ = (param_1->tts).s_;
  _Var2._M_head_impl =
       (param_1->mention_everyone).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>.
       _M_t.super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var2._M_head_impl == (bool *)0x0) {
    _Var6._M_head_impl = (bool *)0x0;
  }
  else {
    _Var6._M_head_impl = (bool *)operator_new(1);
    *_Var6._M_head_impl = *_Var2._M_head_impl;
  }
  (this->mention_everyone).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = _Var6._M_head_impl;
  (this->mention_everyone).s_ = (param_1->mention_everyone).s_;
  field<std::vector<discordpp::User,_std::allocator<discordpp::User>_>_>::field
            (&this->mentions,&param_1->mentions);
  field<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>::field
            (&this->mention_roles,&param_1->mention_roles);
  field<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>::field
            (&(this->mention_channels).
              super_field<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>
             ,&(param_1->mention_channels).
               super_field<std::vector<discordpp::ChannelMention,_std::allocator<discordpp::ChannelMention>_>_>
            );
  (this->mention_channels)._vptr_omittable_field = (_func_int **)&PTR_operator__0024b600;
  field<std::vector<discordpp::Attachment,_std::allocator<discordpp::Attachment>_>_>::field
            (&this->attachments,&param_1->attachments);
  field<std::vector<discordpp::Embed,_std::allocator<discordpp::Embed>_>_>::field
            (&this->embeds,&param_1->embeds);
  field<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>_>::field
            (&(this->reactions).
              super_field<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>_>,
             &(param_1->reactions).
              super_field<std::vector<discordpp::Reaction,_std::allocator<discordpp::Reaction>_>_>);
  (this->reactions)._vptr_omittable_field = (_func_int **)&PTR_operator__0024b880;
  field<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::field(&(this->nonce).
           super_field<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ,&(param_1->nonce).
            super_field<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         );
  (this->nonce)._vptr_omittable_field = (_func_int **)&PTR_operator__0024b8d0;
  _Var2._M_head_impl =
       (param_1->pinned).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var2._M_head_impl == (bool *)0x0) {
    _Var6._M_head_impl = (bool *)0x0;
  }
  else {
    _Var6._M_head_impl = (bool *)operator_new(1);
    *_Var6._M_head_impl = *_Var2._M_head_impl;
  }
  (this->pinned).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = _Var6._M_head_impl;
  (this->pinned).s_ = (param_1->pinned).s_;
  _Var4._M_head_impl =
       (param_1->webhook_id).super_field<discordpp::Snowflake>.t_._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
  if (_Var4._M_head_impl == (Snowflake *)0x0) {
    _Var5._M_head_impl = (Snowflake *)0x0;
  }
  else {
    _Var5._M_head_impl = (Snowflake *)operator_new(8);
    (_Var5._M_head_impl)->_value = (_Var4._M_head_impl)->_value;
  }
  (this->webhook_id).super_field<discordpp::Snowflake>.t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = _Var5._M_head_impl;
  (this->webhook_id).super_field<discordpp::Snowflake>.s_ =
       (param_1->webhook_id).super_field<discordpp::Snowflake>.s_;
  (this->webhook_id)._vptr_omittable_field = (_func_int **)&PTR_operator__0024a5e8;
  _Var3._M_head_impl =
       (param_1->type).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  if (_Var3._M_head_impl == (int *)0x0) {
    _Var7._M_head_impl = (int *)0x0;
  }
  else {
    _Var7._M_head_impl = (int *)operator_new(4);
    *_Var7._M_head_impl = *_Var3._M_head_impl;
  }
  (this->type).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var7._M_head_impl;
  (this->type).s_ = (param_1->type).s_;
  field<discordpp::MessageActivity>::field
            (&(this->activity).super_field<discordpp::MessageActivity>,
             &(param_1->activity).super_field<discordpp::MessageActivity>);
  (this->activity)._vptr_omittable_field = (_func_int **)&PTR_operator__0024b930;
  field<discordpp::Application>::field
            (&(this->application).super_field<discordpp::Application>,
             &(param_1->application).super_field<discordpp::Application>);
  (this->application)._vptr_omittable_field = (_func_int **)&PTR_operator__0024b980;
  _Var4._M_head_impl =
       (param_1->application_id).super_field<discordpp::Snowflake>.t_._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
  if (_Var4._M_head_impl == (Snowflake *)0x0) {
    _Var5._M_head_impl = (Snowflake *)0x0;
  }
  else {
    _Var5._M_head_impl = (Snowflake *)operator_new(8);
    (_Var5._M_head_impl)->_value = (_Var4._M_head_impl)->_value;
  }
  (this->application_id).super_field<discordpp::Snowflake>.t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = _Var5._M_head_impl;
  (this->application_id).super_field<discordpp::Snowflake>.s_ =
       (param_1->application_id).super_field<discordpp::Snowflake>.s_;
  (this->application_id)._vptr_omittable_field = (_func_int **)&PTR_operator__0024a5e8;
  field<discordpp::MessageReference>::field
            (&(this->message_reference).super_field<discordpp::MessageReference>,
             &(param_1->message_reference).super_field<discordpp::MessageReference>);
  (this->message_reference)._vptr_omittable_field = (_func_int **)&PTR_operator__0024b9d0;
  _Var3._M_head_impl =
       (param_1->flags).super_field<int>.t_._M_t.
       super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  if (_Var3._M_head_impl == (int *)0x0) {
    _Var7._M_head_impl = (int *)0x0;
  }
  else {
    _Var7._M_head_impl = (int *)operator_new(4);
    *_Var7._M_head_impl = *_Var3._M_head_impl;
  }
  (this->flags).super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var7._M_head_impl;
  (this->flags).super_field<int>.s_ = (param_1->flags).super_field<int>.s_;
  (this->flags)._vptr_omittable_field = (_func_int **)&PTR_operator__0024a3a0;
  field<discordpp::Message>::field
            (&(this->referenced_message).super_field<discordpp::Message>,
             &(param_1->referenced_message).super_field<discordpp::Message>);
  (this->referenced_message)._vptr_nullable_omittable_field = (_func_int **)&PTR_operator__0024ba20;
  field<discordpp::MessageInteraction>::field
            (&(this->interaction).super_field<discordpp::MessageInteraction>,
             &(param_1->interaction).super_field<discordpp::MessageInteraction>);
  (this->interaction)._vptr_omittable_field = (_func_int **)&PTR_operator__0024ba70;
  field<discordpp::Channel>::field
            (&(this->thread).super_field<discordpp::Channel>,
             &(param_1->thread).super_field<discordpp::Channel>);
  (this->thread)._vptr_omittable_field = (_func_int **)&PTR_operator__0024bac0;
  field<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>_>::field
            (&(this->components).
              super_field<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>_>
             ,&(param_1->components).
               super_field<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>_>
            );
  (this->components)._vptr_omittable_field = (_func_int **)&PTR_operator__0024bb10;
  field<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>_>::field
            (&(this->sticker_items).
              super_field<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>_>
             ,&(param_1->sticker_items).
               super_field<std::vector<discordpp::StickerItem,_std::allocator<discordpp::StickerItem>_>_>
            );
  (this->sticker_items)._vptr_omittable_field = (_func_int **)&PTR_operator__0024bb60;
  field<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_>::field
            (&(this->stickers).
              super_field<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_>,
             &(param_1->stickers).
              super_field<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_>);
  (this->stickers)._vptr_omittable_field = (_func_int **)&PTR_operator__0024a768;
  _Var3._M_head_impl =
       (param_1->position).super_field<int>.t_._M_t.
       super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  if (_Var3._M_head_impl == (int *)0x0) {
    _Var7._M_head_impl = (int *)0x0;
  }
  else {
    _Var7._M_head_impl = (int *)operator_new(4);
    *_Var7._M_head_impl = *_Var3._M_head_impl;
  }
  (this->position).super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>.
  _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var7._M_head_impl;
  (this->position).super_field<int>.s_ = (param_1->position).super_field<int>.s_;
  (this->position)._vptr_omittable_field = (_func_int **)&PTR_operator__0024a3a0;
  field<discordpp::RoleSubscriptionData>::field
            (&(this->role_subscription_data).super_field<discordpp::RoleSubscriptionData>,
             &(param_1->role_subscription_data).super_field<discordpp::RoleSubscriptionData>);
  (this->role_subscription_data)._vptr_omittable_field = (_func_int **)&PTR_operator__0024bbb0;
  return;
}

Assistant:

Message(
        field<Snowflake> id = uninitialized,
        field<Snowflake> channel_id = uninitialized,
        field<User> author = uninitialized,
        field<std::string> content = uninitialized,
        field<Timestamp> timestamp = uninitialized,
        nullable_field<Timestamp> edited_timestamp = uninitialized,
        field<bool> tts = uninitialized,
        field<bool> mention_everyone = uninitialized,
        field<std::vector<User> > mentions = uninitialized,
        field<std::vector<Snowflake> > mention_roles = uninitialized,
        omittable_field<std::vector<ChannelMention> > mention_channels = omitted,
        field<std::vector<Attachment> > attachments = uninitialized,
        field<std::vector<Embed> > embeds = uninitialized,
        omittable_field<std::vector<Reaction> > reactions = omitted,
        omittable_field<std::variant<int, std::string> > nonce = omitted,
        field<bool> pinned = uninitialized,
        omittable_field<Snowflake> webhook_id = omitted,
        field<int> type = uninitialized,
        omittable_field<MessageActivity> activity = omitted,
        omittable_field<Application> application = omitted,
        omittable_field<Snowflake> application_id = omitted,
        omittable_field<MessageReference> message_reference = omitted,
        omittable_field<int> flags = omitted,
        nullable_omittable_field<Message> referenced_message = omitted,
        omittable_field<MessageInteraction> interaction = omitted,
        omittable_field<Channel> thread = omitted,
        omittable_field<std::vector<Component> > components = omitted,
        omittable_field<std::vector<StickerItem> > sticker_items = omitted,
        omittable_field<std::vector<Sticker> > stickers = omitted,
        omittable_field<int> position = omitted,
        omittable_field<RoleSubscriptionData> role_subscription_data = omitted
    ):
        id(id),
        channel_id(channel_id),
        author(author),
        content(content),
        timestamp(timestamp),
        edited_timestamp(edited_timestamp),
        tts(tts),
        mention_everyone(mention_everyone),
        mentions(mentions),
        mention_roles(mention_roles),
        mention_channels(mention_channels),
        attachments(attachments),
        embeds(embeds),
        reactions(reactions),
        nonce(nonce),
        pinned(pinned),
        webhook_id(webhook_id),
        type(type),
        activity(activity),
        application(application),
        application_id(application_id),
        message_reference(message_reference),
        flags(flags),
        referenced_message(referenced_message),
        interaction(interaction),
        thread(thread),
        components(components),
        sticker_items(sticker_items),
        stickers(stickers),
        position(position),
        role_subscription_data(role_subscription_data)
    {}